

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O0

void __thiscall adios2::ADIOS::EnterComputationBlock(ADIOS *this)

{
  string *in_stack_00000018;
  ADIOS *in_stack_00000020;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"in call to ADIOS::EnterComputationBlock()",&local_29);
  CheckPointer(in_stack_00000020,in_stack_00000018);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::__shared_ptr_access<adios2::core::ADIOS,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<adios2::core::ADIOS,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x286059);
  adios2::core::ADIOS::EnterComputationBlock();
  return;
}

Assistant:

void ADIOS::EnterComputationBlock() noexcept
{
    CheckPointer("in call to ADIOS::EnterComputationBlock()");
    m_ADIOS->EnterComputationBlock();
}